

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  uint uVar1;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
LAB_001079ba:
    uVar1 = 0;
    _glfwInputError(error,(char *)0x0);
  }
  else {
    switch(attrib) {
    case 0x22001:
      uVar1 = *(uint *)(handle + 0x1bc);
      break;
    case 0x22002:
      uVar1 = *(uint *)(handle + 0x1c0);
      break;
    case 0x22003:
      uVar1 = *(uint *)(handle + 0x1c4);
      break;
    case 0x22004:
      uVar1 = *(uint *)(handle + 0x1c8);
      break;
    case 0x22005:
      uVar1 = *(uint *)(handle + 0x1d4);
      break;
    case 0x22006:
      uVar1 = (uint)(byte)handle[0x1cc];
      break;
    case 0x22007:
      uVar1 = (uint)(byte)handle[0x1cd];
      break;
    case 0x22008:
      uVar1 = *(uint *)(handle + 0x1d0);
      break;
    default:
      switch(attrib) {
      case 0x20001:
        uVar1 = (uint)(_glfw.focusedWindow == (_GLFWwindow *)handle);
        break;
      case 0x20002:
        uVar1 = (uint)(byte)handle[8];
        break;
      case 0x20003:
        uVar1 = (uint)(byte)handle[9];
        break;
      case 0x20004:
        uVar1 = (uint)(byte)handle[0xb];
        break;
      case 0x20005:
        uVar1 = (uint)(byte)handle[10];
        break;
      default:
        error = 0x10003;
        goto LAB_001079ba;
      }
    }
  }
  return uVar1;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return window == _glfw.focusedWindow;
        case GLFW_ICONIFIED:
            return window->iconified;
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_VISIBLE:
            return window->visible;
        case GLFW_CLIENT_API:
            return window->clientAPI;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->glMajor;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->glMinor;
        case GLFW_CONTEXT_REVISION:
            return window->glRevision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->glRobustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->glForward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->glDebug;
        case GLFW_OPENGL_PROFILE:
            return window->glProfile;
    }

    _glfwInputError(GLFW_INVALID_ENUM, NULL);
    return 0;
}